

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O1

bool __thiscall
S2MinDistanceShapeIndexTarget::VisitContainingShapes
          (S2MinDistanceShapeIndexTarget *this,S2ShapeIndex *query_index,ShapeVisitor *visitor)

{
  S2ShapeIndex *pSVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  S2MinDistancePointTarget target;
  ReferencePoint ref;
  bool local_9d;
  S2MinDistancePointTarget local_80;
  VType local_60;
  VType VStack_58;
  VType local_50;
  char local_48;
  long *plVar6;
  
  pSVar1 = this->index_;
  uVar4 = (*pSVar1->_vptr_S2ShapeIndex[2])();
  local_9d = uVar4 == 0;
  if (!local_9d) {
    uVar10 = 0;
    do {
      iVar5 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,uVar10);
      plVar6 = (long *)CONCAT44(extraout_var,iVar5);
      if (plVar6 == (long *)0x0) {
        cVar3 = '\x03';
      }
      else {
        iVar5 = (**(code **)(*plVar6 + 0x30))(plVar6);
        iVar8 = 0;
        if (iVar5 < 1) {
          cVar3 = '\x04';
          bVar2 = false;
        }
        else {
          bVar2 = false;
          do {
            uVar7 = (**(code **)(*plVar6 + 0x38))(plVar6,iVar8);
            cVar3 = '\x06';
            if (uVar7 >> 0x20 != 0) {
              (**(code **)(*plVar6 + 0x40))(&local_60,plVar6,iVar8,0);
              local_80.point_.c_[2] = local_50;
              local_80.point_.c_[0] = local_60;
              local_80.point_.c_[1] = VStack_58;
              local_80.super_S2MinDistanceTarget._vptr_S2DistanceTarget =
                   (_func_int **)&PTR__S2DistanceTarget_002c29a0;
              bVar2 = S2MinDistancePointTarget::VisitContainingShapes(&local_80,query_index,visitor)
              ;
              cVar3 = !bVar2;
              bVar2 = true;
            }
            if ((cVar3 != '\x06') && (cVar3 != '\0')) goto LAB_002070f9;
            iVar8 = iVar8 + 1;
          } while (iVar5 != iVar8);
          cVar3 = '\x04';
        }
LAB_002070f9:
        if (cVar3 == '\x04') {
          if (!bVar2) {
            (**(code **)(*plVar6 + 0x28))(&local_60,plVar6);
            cVar3 = '\x03';
            if (local_48 == '\x01') {
              local_80.super_S2MinDistanceTarget._vptr_S2DistanceTarget =
                   (_func_int **)&PTR__S2DistanceTarget_002c29a0;
              local_80.point_.c_[2] = local_50;
              local_80.point_.c_[0] = local_60;
              local_80.point_.c_[1] = VStack_58;
              bVar2 = S2MinDistancePointTarget::VisitContainingShapes(&local_80,query_index,visitor)
              ;
              cVar3 = !bVar2;
            }
            if (cVar3 != '\0') goto LAB_00207158;
          }
          cVar3 = '\0';
        }
      }
LAB_00207158:
      if ((cVar3 != '\x03') && (cVar3 != '\0')) {
        return local_9d;
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
      local_9d = uVar9 == uVar4;
    } while (!local_9d);
  }
  return local_9d;
}

Assistant:

bool S2MinDistanceShapeIndexTarget::VisitContainingShapes(
    const S2ShapeIndex& query_index, const ShapeVisitor& visitor) {
  // It is sufficient to find the set of chain starts in the target index
  // (i.e., one vertex per connected component of edges) that are contained by
  // the query index, except for one special case to handle full polygons.
  //
  // TODO(ericv): Do this by merge-joining the two S2ShapeIndexes, and share
  // the code with S2BooleanOperation.

  for (S2Shape* shape : *index_) {
    if (shape == nullptr) continue;
    int num_chains = shape->num_chains();
    // Shapes that don't have any edges require a special case (below).
    bool tested_point = false;
    for (int c = 0; c < num_chains; ++c) {
      S2Shape::Chain chain = shape->chain(c);
      if (chain.length == 0) continue;
      tested_point = true;
      S2Point v0 = shape->chain_edge(c, 0).v0;
      S2MinDistancePointTarget target(v0);
      if (!target.VisitContainingShapes(query_index, visitor)) {
        return false;
      }
    }
    if (!tested_point) {
      // Special case to handle full polygons.
      S2Shape::ReferencePoint ref = shape->GetReferencePoint();
      if (!ref.contained) continue;
      S2MinDistancePointTarget target(ref.point);
      if (!target.VisitContainingShapes(query_index, visitor)) {
        return false;
      }
    }
  }
  return true;
}